

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::PrintTo<unsigned_long,Eigen::Matrix<long,_1,1,0,_1,1>>
               (pair<unsigned_long,_Eigen::Matrix<long,__1,_1,_0,__1,_1>_> *value,ostream *os)

{
  ostream *in_RSI;
  ostream *in_stack_ffffffffffffffe8;
  
  std::operator<<(in_RSI,'(');
  UniversalPrinter<unsigned_long>::Print((unsigned_long *)in_RSI,in_stack_ffffffffffffffe8);
  std::operator<<(in_RSI,", ");
  UniversalPrinter<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>_>::Print
            ((Matrix<long,__1,_1,_0,__1,_1> *)in_RSI,in_stack_ffffffffffffffe8);
  std::operator<<(in_RSI,')');
  return;
}

Assistant:

void PrintTo(const ::std::pair<T1, T2>& value, ::std::ostream* os) {
  *os << '(';
  // We cannot use UniversalPrint(value.first, os) here, as T1 may be
  // a reference type.  The same for printing value.second.
  UniversalPrinter<T1>::Print(value.first, os);
  *os << ", ";
  UniversalPrinter<T2>::Print(value.second, os);
  *os << ')';
}